

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

void __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:81:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:86:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:91:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:107:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:122:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:127:9)>
::recreateMortonCodes
          (BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:81:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:86:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:91:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:107:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:122:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:127:9)>
           *this,range<unsigned_int> *current)

{
  PrimRef *pPVar1;
  Vec3fx *pVVar2;
  PrimRef *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char cVar8;
  task *ptVar9;
  runtime_error *prVar10;
  size_t i;
  ulong uVar11;
  ulong uVar12;
  size_t i_1;
  ulong uVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined8 extraout_XMM1_Qa;
  float fVar17;
  float fVar18;
  undefined1 auVar16 [16];
  undefined8 extraout_XMM1_Qb;
  float fVar19;
  uint uVar20;
  uint uVar23;
  uint uVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM4 [16];
  auto_partitioner local_171;
  small_object_pool *local_170;
  MortonCodeMapping mapping;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  anon_class_16_2_ed117de8_conflict local_128;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  body;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  anon_class_8_1_8991fb9c calculateCentBounds;
  task_group_context context;
  
  uVar20 = current->_begin;
  uVar13 = (ulong)uVar20;
  uVar23 = current->_end;
  uVar12 = (ulong)uVar23;
  if (uVar23 - uVar20 < 0x400) {
    auVar14 = _DAT_01f45a30;
    auVar21 = _DAT_01f45a40;
    for (uVar11 = uVar13; uVar11 < uVar12; uVar11 = uVar11 + 1) {
      pPVar3 = *this->calculateBounds->prims;
      uVar20 = this->morton[uVar11].field_0.field_0.index;
      pPVar1 = pPVar3 + uVar20;
      pVVar2 = &pPVar3[uVar20].upper;
      auVar16._0_4_ = (pPVar1->lower).field_0.m128[0] + (pVVar2->field_0).m128[0];
      auVar16._4_4_ = (pPVar1->lower).field_0.m128[1] + (pVVar2->field_0).m128[1];
      auVar16._8_4_ = (pPVar1->lower).field_0.m128[2] + (pVVar2->field_0).m128[2];
      auVar16._12_4_ = (pPVar1->lower).field_0.m128[3] + (pVVar2->field_0).m128[3];
      auVar14 = minps(auVar14,auVar16);
      auVar21 = maxps(auVar21,auVar16);
    }
    auVar22._0_4_ = auVar21._0_4_ - auVar14._0_4_;
    auVar22._4_4_ = auVar21._4_4_ - auVar14._4_4_;
    auVar22._8_4_ = auVar21._8_4_ - auVar14._8_4_;
    auVar22._12_4_ = auVar21._12_4_ - auVar14._12_4_;
    auVar21 = rcpps(in_XMM4,auVar22);
    fVar15 = auVar21._0_4_;
    fVar17 = auVar21._4_4_;
    fVar18 = auVar21._8_4_;
    for (; uVar13 < uVar12; uVar13 = uVar13 + 1) {
      pPVar3 = *this->calculateBounds->prims;
      uVar20 = this->morton[uVar13].field_0.field_0.index;
      pPVar1 = pPVar3 + uVar20;
      pVVar2 = &pPVar3[uVar20].upper;
      uVar20 = (uint)((((pPVar1->lower).field_0.m128[0] + (pVVar2->field_0).m128[0]) - auVar14._0_4_
                      ) * (float)((uint)(((1.0 - auVar22._0_4_ * fVar15) * fVar15 + fVar15) *
                                        1013.76) & -(uint)(1e-19 < auVar22._0_4_)));
      uVar23 = (uint)((((pPVar1->lower).field_0.m128[1] + (pVVar2->field_0).m128[1]) - auVar14._4_4_
                      ) * (float)((uint)(((1.0 - auVar22._4_4_ * fVar17) * fVar17 + fVar17) *
                                        1013.76) & -(uint)(1e-19 < auVar22._4_4_)));
      uVar24 = (uint)((((pPVar1->lower).field_0.m128[2] + (pVVar2->field_0).m128[2]) - auVar14._8_4_
                      ) * (float)((uint)(((1.0 - auVar22._8_4_ * fVar18) * fVar18 + fVar18) *
                                        1013.76) & -(uint)(1e-19 < auVar22._8_4_)));
      this->morton[uVar13].field_0.field_0.code =
           ((((uVar24 << 0x10 | uVar24) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 0x14
           & 0x24924924 |
           ((((uVar23 << 0x10 | uVar23) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 10 &
           0x12492492 |
           ((((uVar20 << 0x10 | uVar20) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 5 &
           0x9249249;
      uVar12 = (ulong)current->_end;
    }
    std::__sort<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
              (this->morton + current->_begin,this->morton + uVar12);
    return;
  }
  local_d8._0_8_ = 0x7f8000007f800000;
  local_d8._8_8_ = 0x7f8000007f800000;
  local_c8 = 0xff800000ff800000;
  uStack_c0 = 0xff800000ff800000;
  calculateCentBounds.this = this;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  body.my_real_body = &local_128;
  local_128.reduction = BBox<embree::Vec3fa>::merge;
  body.my_reduction = BBox<embree::Vec3fa>::merge;
  body.my_value.lower.field_0._0_8_ = 0x7f8000007f800000;
  body.my_value.lower.field_0._8_8_ = 0x7f8000007f800000;
  body.my_value.upper.field_0._0_8_ = 0xff800000ff800000;
  body.my_value.upper.field_0._8_8_ = 0xff800000ff800000;
  local_128.func = &calculateCentBounds;
  body.my_identity_element = (BBox<embree::Vec3fa> *)&local_d8;
  if (uVar20 < uVar23) {
    mapping.base.field_0._0_8_ = 0;
    mapping.base.field_0.v[2] = 1.4013e-45;
    mapping.scale.field_0._0_8_ = 1;
    mapping.scale.field_0._8_8_ = 1;
    local_170 = (small_object_pool *)0x0;
    ptVar9 = (task *)tbb::detail::r1::allocate(&local_170,0x80);
    ptVar9->m_reserved[3] = 0;
    ptVar9->m_reserved[4] = 0;
    ptVar9->m_reserved[1] = 0;
    ptVar9->m_reserved[2] = 0;
    (ptVar9->super_task_traits).m_version_and_traits = 0;
    ptVar9->m_reserved[0] = 0;
    ptVar9->m_reserved[5] = 0;
    ptVar9->_vptr_task = (_func_int **)&PTR__task_021d4050;
    *(uint *)&ptVar9[1]._vptr_task = uVar23;
    *(uint *)((long)&ptVar9[1]._vptr_task + 4) = uVar20;
    ptVar9[1].super_task_traits.m_version_and_traits = 0x400;
    ptVar9[1].m_reserved[0] = (uint64_t)&body;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar9[1].m_reserved + 2),&local_171);
    ptVar9[1].m_reserved[4] = (uint64_t)local_170;
    *(undefined1 *)(ptVar9[1].m_reserved + 5) = 0;
    ptVar9[1].m_reserved[1] = (uint64_t)&mapping;
    tbb::detail::r1::execute_and_wait(ptVar9,&context,(wait_context *)&mapping.scale,&context);
  }
  uVar7 = body.my_value.upper.field_0._8_8_;
  uVar6 = body.my_value.upper.field_0._0_8_;
  uVar5 = body.my_value.lower.field_0._8_8_;
  uVar4 = body.my_value.lower.field_0._0_8_;
  cVar8 = tbb::detail::r1::is_group_execution_cancelled(&context);
  auVar14._8_8_ = extraout_XMM1_Qb;
  auVar14._0_8_ = extraout_XMM1_Qa;
  if (cVar8 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    local_d8._8_8_ = &mapping;
    local_148 = (float)uVar4;
    fStack_144 = (float)((ulong)uVar4 >> 0x20);
    fStack_140 = (float)uVar5;
    fStack_13c = (float)((ulong)uVar5 >> 0x20);
    mapping.base.field_0._0_8_ = uVar4;
    mapping.base.field_0.v[2] = fStack_140;
    mapping.base.field_0.v[3] = fStack_13c;
    local_138 = (float)uVar6;
    fStack_134 = (float)((ulong)uVar6 >> 0x20);
    fStack_130 = (float)uVar7;
    fStack_12c = (float)((ulong)uVar7 >> 0x20);
    local_138 = local_138 - local_148;
    fStack_134 = fStack_134 - fStack_144;
    fStack_130 = fStack_130 - fStack_140;
    fStack_12c = fStack_12c - fStack_13c;
    auVar21._4_4_ = fStack_134;
    auVar21._0_4_ = local_138;
    auVar21._8_4_ = fStack_130;
    auVar21._12_4_ = fStack_12c;
    auVar14 = rcpps(auVar14,auVar21);
    fVar15 = auVar14._0_4_;
    fVar17 = auVar14._4_4_;
    fVar18 = auVar14._8_4_;
    fVar19 = auVar14._12_4_;
    mapping.scale.field_0.i[1] =
         (uint)(((1.0 - fStack_134 * fVar17) * fVar17 + fVar17) * 1013.76) &
         -(uint)(1e-19 < fStack_134);
    mapping.scale.field_0.i[0] =
         (uint)(((1.0 - local_138 * fVar15) * fVar15 + fVar15) * 1013.76) &
         -(uint)(1e-19 < local_138);
    mapping.scale.field_0.i[3] =
         (uint)(((1.0 - fStack_12c * fVar19) * fVar19 + fVar19) * 1013.76) &
         -(uint)(1e-19 < fStack_12c);
    mapping.scale.field_0.i[2] =
         (uint)(((1.0 - fStack_130 * fVar18) * fVar18 + fVar18) * 1013.76) &
         -(uint)(1e-19 < fStack_130);
    uVar20 = current->_begin;
    uVar23 = current->_end;
    local_d8._0_8_ = this;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    if (uVar20 < uVar23) {
      local_128.reduction =
           (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)0x0;
      ptVar9 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_128,0x80);
      ptVar9->m_reserved[3] = 0;
      ptVar9->m_reserved[4] = 0;
      ptVar9->m_reserved[1] = 0;
      ptVar9->m_reserved[2] = 0;
      (ptVar9->super_task_traits).m_version_and_traits = 0;
      ptVar9->m_reserved[0] = 0;
      ptVar9->m_reserved[5] = 0;
      ptVar9->_vptr_task = (_func_int **)&PTR__task_021d4098;
      *(uint *)&ptVar9[1]._vptr_task = uVar23;
      *(uint *)((long)&ptVar9[1]._vptr_task + 4) = uVar20;
      ptVar9[1].super_task_traits.m_version_and_traits = 0x400;
      ptVar9[1].m_reserved[0] = (uint64_t)&local_d8;
      tbb::detail::d1::auto_partition_type::auto_partition_type
                ((auto_partition_type *)(ptVar9[1].m_reserved + 2),(auto_partitioner *)&local_170);
      ptVar9[1].m_reserved[4] = (uint64_t)local_128.reduction;
      body.my_identity_element = (BBox<embree::Vec3fa> *)0x0;
      body.my_real_body = (anon_class_16_2_ed117de8_conflict *)CONCAT44(body.my_real_body._4_4_,1);
      body.my_reduction =
           (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)0x1;
      body._24_8_ = 1;
      ptVar9[1].m_reserved[1] = (uint64_t)&body;
      tbb::detail::r1::execute_and_wait(ptVar9,&context,(wait_context *)&body.my_reduction,&context)
      ;
    }
    cVar8 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar8 == '\0') {
      tbb::detail::d1::task_group_context::~task_group_context(&context);
      tbb::detail::d1::parallel_sort<embree::sse2::BVHBuilderMorton::BuildPrim*>
                (this->morton + current->_begin,this->morton + current->_end);
      return;
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"task cancelled");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"task cancelled");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }